

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_float_linear_ARGB(void *outputp,int width_times_channels,float *encode)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 *local_100;
  float *local_f8;
  __m128 e0_1;
  __m128 e1;
  __m128 e0;
  float *end_encode_m8;
  float *end_output;
  float *output;
  float *encode_local;
  undefined4 uStack_28;
  int width_times_channels_local;
  void *outputp_local;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  puVar1 = (undefined8 *)((long)outputp + (long)width_times_channels * 4);
  if (width_times_channels < 8) {
    local_f8 = encode;
    for (local_100 = (undefined8 *)((long)outputp + 0x10); local_100 <= puVar1;
        local_100 = local_100 + 2) {
      output._0_4_ = (undefined4)*(undefined8 *)local_f8;
      output._4_4_ = (undefined4)((ulong)*(undefined8 *)local_f8 >> 0x20);
      encode_local._0_4_ = (undefined4)*(undefined8 *)(local_f8 + 2);
      encode_local._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_f8 + 2) >> 0x20);
      local_100[-2] = CONCAT44(output._0_4_,encode_local._4_4_);
      local_100[-1] = CONCAT44(encode_local._0_4_,output._4_4_);
      local_f8 = local_f8 + 4;
    }
  }
  else {
    local_100 = (undefined8 *)outputp;
    local_f8 = encode;
    do {
      do {
        local_18 = (undefined4)*(undefined8 *)local_f8;
        uStack_14 = (undefined4)((ulong)*(undefined8 *)local_f8 >> 0x20);
        uStack_10 = (undefined4)*(undefined8 *)(local_f8 + 2);
        uStack_c = (undefined4)((ulong)*(undefined8 *)(local_f8 + 2) >> 0x20);
        uStack_28 = (undefined4)*(undefined8 *)(local_f8 + 4);
        width_times_channels_local = (int)((ulong)*(undefined8 *)(local_f8 + 4) >> 0x20);
        outputp_local._0_4_ = (undefined4)*(undefined8 *)(local_f8 + 6);
        outputp_local._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_f8 + 6) >> 0x20);
        *local_100 = CONCAT44(local_18,uStack_c);
        local_100[1] = CONCAT44(uStack_10,uStack_14);
        local_100[2] = CONCAT44(uStack_28,outputp_local._4_4_);
        local_100[3] = CONCAT44(outputp_local._0_4_,width_times_channels_local);
        local_f8 = local_f8 + 8;
        local_100 = local_100 + 4;
      } while (local_100 < puVar1 + -4);
      bVar2 = local_100 != puVar1;
      local_100 = puVar1 + -4;
      local_f8 = encode + (long)width_times_channels + -8;
    } while (bVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  #if !defined( STBIR_FLOAT_HIGH_CLAMP ) && !defined(STBIR_FLOAT_LO_CLAMP) && !defined(stbir__decode_swizzle)

  if ( (void*)outputp != (void*) encode )
    STBIR_MEMCPY( outputp, encode, width_times_channels * sizeof( float ) );

  #else

  float STBIR_SIMD_STREAMOUT_PTR( * ) output = (float*) outputp;
  float * end_output = ( (float*) output ) + width_times_channels;

  #ifdef STBIR_FLOAT_HIGH_CLAMP
  #define stbir_scalar_hi_clamp( v ) if ( v > STBIR_FLOAT_HIGH_CLAMP ) v = STBIR_FLOAT_HIGH_CLAMP;
  #else
  #define stbir_scalar_hi_clamp( v )
  #endif
  #ifdef STBIR_FLOAT_LOW_CLAMP
  #define stbir_scalar_lo_clamp( v ) if ( v < STBIR_FLOAT_LOW_CLAMP ) v = STBIR_FLOAT_LOW_CLAMP;
  #else
  #define stbir_scalar_lo_clamp( v )
  #endif

  #ifdef STBIR_SIMD

  #ifdef STBIR_FLOAT_HIGH_CLAMP
  const stbir__simdfX high_clamp = stbir__simdf_frepX(STBIR_FLOAT_HIGH_CLAMP);
  #endif
  #ifdef STBIR_FLOAT_LOW_CLAMP
  const stbir__simdfX low_clamp = stbir__simdf_frepX(STBIR_FLOAT_LOW_CLAMP);
  #endif

  if ( width_times_channels >= ( stbir__simdfX_float_count * 2 ) )
  {
    float const * end_encode_m8 = encode + width_times_channels - ( stbir__simdfX_float_count * 2 );
    end_output -= ( stbir__simdfX_float_count * 2 );
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_load( e0, encode );
      stbir__simdfX_load( e1, encode+stbir__simdfX_float_count );
#ifdef STBIR_FLOAT_HIGH_CLAMP
      stbir__simdfX_min( e0, e0, high_clamp );
      stbir__simdfX_min( e1, e1, high_clamp );
#endif
#ifdef STBIR_FLOAT_LOW_CLAMP
      stbir__simdfX_max( e0, e0, low_clamp );
      stbir__simdfX_max( e1, e1, low_clamp );
#endif
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      stbir__simdfX_store( output, e0 );
      stbir__simdfX_store( output+stbir__simdfX_float_count, e1 );
      encode += stbir__simdfX_float_count * 2;
      output += stbir__simdfX_float_count * 2;
      if ( output < end_output )
        continue;
      if ( output == ( end_output + ( stbir__simdfX_float_count * 2 ) ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
#ifdef STBIR_FLOAT_HIGH_CLAMP
    stbir__simdf_min( e0, e0, high_clamp );
#endif
#ifdef STBIR_FLOAT_LOW_CLAMP
    stbir__simdf_max( e0, e0, low_clamp );
#endif
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_store( output-4, e0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float e;
    STBIR_SIMD_NO_UNROLL(encode);
    e = encode[ stbir__encode_order0 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[0-4] = e;
    e = encode[ stbir__encode_order1 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[1-4] = e;
    e = encode[ stbir__encode_order2 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[2-4] = e;
    e = encode[ stbir__encode_order3 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[3-4] = e;
    output += 4;
    encode += 4;
  }
  output -= 4;

  #endif

  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float e;
    STBIR_NO_UNROLL(encode);
    e = encode[ stbir__encode_order0 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[0] = e;
    #if stbir__coder_min_num >= 2
    e = encode[ stbir__encode_order1 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[1] = e;
    #endif
    #if stbir__coder_min_num >= 3
    e = encode[ stbir__encode_order2 ]; stbir_scalar_hi_clamp( e ); stbir_scalar_lo_clamp( e ); output[2] = e;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #endif
}